

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

void __thiscall CConnman::ASMapHealthCheck(CConnman *this)

{
  pointer pCVar1;
  long in_FS_OFFSET;
  vector<CNetAddr,_std::allocator<CNetAddr>_> clearnet_addrs;
  vector<CAddress,_std::allocator<CAddress>_> v6_addrs;
  vector<CAddress,_std::allocator<CAddress>_> v4_addrs;
  CNetAddr local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  GetAddresses(&v4_addrs,this,0,0,(optional<Network>)0x100000001,false);
  GetAddresses(&v6_addrs,this,0,0,(optional<Network>)0x100000002,false);
  clearnet_addrs.super__Vector_base<CNetAddr,_std::allocator<CNetAddr>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  clearnet_addrs.super__Vector_base<CNetAddr,_std::allocator<CNetAddr>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  clearnet_addrs.super__Vector_base<CNetAddr,_std::allocator<CNetAddr>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<CNetAddr,_std::allocator<CNetAddr>_>::reserve
            (&clearnet_addrs,
             ((long)v4_addrs.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)v4_addrs.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                   super__Vector_impl_data._M_start) / 0x38 +
             ((long)v6_addrs.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)v6_addrs.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                   super__Vector_impl_data._M_start) / 0x38);
  for (pCVar1 = v4_addrs.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                super__Vector_impl_data._M_start;
      pCVar1 != v4_addrs.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                super__Vector_impl_data._M_finish; pCVar1 = pCVar1 + 1) {
    CNetAddr::CNetAddr(&local_50,(CNetAddr *)pCVar1);
    std::vector<CNetAddr,_std::allocator<CNetAddr>_>::emplace_back<CNetAddr>
              (&clearnet_addrs,&local_50);
    prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector(&local_50.m_addr);
  }
  for (pCVar1 = v6_addrs.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                super__Vector_impl_data._M_start;
      pCVar1 != v6_addrs.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                super__Vector_impl_data._M_finish; pCVar1 = pCVar1 + 1) {
    CNetAddr::CNetAddr(&local_50,(CNetAddr *)pCVar1);
    std::vector<CNetAddr,_std::allocator<CNetAddr>_>::emplace_back<CNetAddr>
              (&clearnet_addrs,&local_50);
    prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector(&local_50.m_addr);
  }
  NetGroupManager::ASMapHealthCheck(this->m_netgroupman,&clearnet_addrs);
  std::vector<CNetAddr,_std::allocator<CNetAddr>_>::~vector(&clearnet_addrs);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector(&v6_addrs);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector(&v4_addrs);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CConnman::ASMapHealthCheck()
{
    const std::vector<CAddress> v4_addrs{GetAddresses(/*max_addresses=*/ 0, /*max_pct=*/ 0, Network::NET_IPV4, /*filtered=*/ false)};
    const std::vector<CAddress> v6_addrs{GetAddresses(/*max_addresses=*/ 0, /*max_pct=*/ 0, Network::NET_IPV6, /*filtered=*/ false)};
    std::vector<CNetAddr> clearnet_addrs;
    clearnet_addrs.reserve(v4_addrs.size() + v6_addrs.size());
    std::transform(v4_addrs.begin(), v4_addrs.end(), std::back_inserter(clearnet_addrs),
        [](const CAddress& addr) { return static_cast<CNetAddr>(addr); });
    std::transform(v6_addrs.begin(), v6_addrs.end(), std::back_inserter(clearnet_addrs),
        [](const CAddress& addr) { return static_cast<CNetAddr>(addr); });
    m_netgroupman.ASMapHealthCheck(clearnet_addrs);
}